

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_pointerLikeType_load(sysbvm_context_t *context,sysbvm_tuple_t pointerLikeValue)

{
  uint uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  undefined8 uVar5;
  undefined8 uStack_50;
  sysbvm_tuple_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  if (pointerLikeValue == 0) {
    sysbvm_error("Accessing null pointer.");
  }
  sVar3 = sysbvm_tuple_getType(context,pointerLikeValue);
  _Var2 = sysbvm_type_isPointerLikeType(sVar3);
  if (!_Var2) {
    _Var2 = sysbvm_tuple_isKindOf(context,sVar3,(context->roots).valueType);
    if (_Var2) {
      return pointerLikeValue;
    }
    sysbvm_error("Expected a pointer like value.");
  }
  if (((pointerLikeValue & 0xf) == 0 && pointerLikeValue != 0) &&
     (uVar1 = *(uint *)(pointerLikeValue + 0xc), 7 < uVar1)) {
    sVar3 = *(sysbvm_tuple_t *)(pointerLikeValue + 0x10);
    uStack_50 = 0xc;
    if (0xf < uVar1) {
      uVar5 = *(undefined8 *)(pointerLikeValue + 0x18);
      if ((uVar1 & 0xfffffff8) != 0x10) {
        uStack_50 = *(undefined8 *)(pointerLikeValue + 0x20);
      }
      goto LAB_0013644c;
    }
  }
  else {
    sysbvm_error("Expected a pointer like value with at least single slot.");
    sVar3 = *(sysbvm_tuple_t *)(pointerLikeValue + 0x10);
  }
  uStack_50 = 0xc;
  uVar5 = 0;
LAB_0013644c:
  sVar4 = sysbvm_tuple_getType(context,sVar3);
  if (sVar4 == (context->roots).valueBoxType) {
    sVar3 = *(sysbvm_tuple_t *)(sVar3 + 0x10);
  }
  else {
    sVar4 = sysbvm_tuple_getType(context,pointerLikeValue);
    local_30 = *(undefined8 *)(sVar4 + 0xf8);
    local_48 = sVar3;
    local_40 = uVar5;
    local_38 = uStack_50;
    sVar3 = sysbvm_tuple_send(context,(context->roots).loadFromAtOffsetWithTypeSelector,4,&local_48,
                              0);
  }
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_pointerLikeType_load(sysbvm_context_t *context, sysbvm_tuple_t pointerLikeValue)
{
    if(!pointerLikeValue)
        sysbvm_error("Accessing null pointer.");
    sysbvm_tuple_t valueType = sysbvm_tuple_getType(context, pointerLikeValue);
    if(!sysbvm_type_isPointerLikeType(valueType))
    {
        // HACK: Allow treating the value types as pointers to themselves.
        if(sysbvm_tuple_isKindOf(context, valueType, context->roots.valueType))
            return pointerLikeValue;

        sysbvm_error("Expected a pointer like value.");
    }

    size_t slotCount = sysbvm_tuple_getSizeInSlots(pointerLikeValue);
    if(slotCount == 0)
        sysbvm_error("Expected a pointer like value with at least single slot.");

    sysbvm_object_tuple_t *pointerObject = (sysbvm_object_tuple_t*)pointerLikeValue;
    sysbvm_tuple_t storage = pointerObject->pointers[0];
    sysbvm_tuple_t base = SYSBVM_NULL_TUPLE;
    intptr_t offset = sysbvm_tuple_intptr_encode(context, 0);
    if(slotCount >= 2)
    {
        base = pointerObject->pointers[1];
        if(slotCount >= 3)
            offset = pointerObject->pointers[2];
    }

    if(sysbvm_tuple_getType(context, storage) == context->roots.valueBoxType)
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(storage)->pointers[0];

    sysbvm_pointerLikeType_t *pointerLikeType = (sysbvm_pointerLikeType_t*)sysbvm_tuple_getType(context, pointerLikeValue);
    return sysbvm_tuple_send3(context, context->roots.loadFromAtOffsetWithTypeSelector, storage, base, offset, pointerLikeType->baseType);
}